

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dimension2d.h
# Opt level: O0

dimension2d<unsigned_int> __thiscall
irr::core::dimension2d<unsigned_int>::getOptimalSize
          (dimension2d<unsigned_int> *this,bool requirePowerOfTwo,bool requireSquare,bool larger,
          u32 maxValue)

{
  uint uVar1;
  byte in_CL;
  byte in_DL;
  byte in_SIL;
  uint *in_RDI;
  uint in_R8D;
  u32 j;
  u32 i;
  uint local_28;
  uint local_24;
  uint local_20;
  uint local_1c;
  byte local_13;
  byte local_12;
  byte local_11;
  dimension2d<unsigned_int> local_8;
  
  local_11 = in_SIL & 1;
  local_12 = in_DL & 1;
  local_13 = in_CL & 1;
  local_1c = 1;
  local_20 = 1;
  if (local_11 == 0) {
    local_1c = *in_RDI;
    local_20 = in_RDI[1];
  }
  else {
    for (; local_1c < *in_RDI; local_1c = local_1c << 1) {
    }
    if (((local_13 == 0) && (local_1c != 1)) && (local_1c != *in_RDI)) {
      local_1c = local_1c >> 1;
    }
    for (; local_20 < in_RDI[1]; local_20 = local_20 << 1) {
    }
    if (((local_13 == 0) && (local_20 != 1)) && (local_20 != in_RDI[1])) {
      local_20 = local_20 >> 1;
    }
  }
  uVar1 = local_20;
  if (((local_12 != 0) && ((local_13 == 0 || (uVar1 = local_1c, local_1c <= local_20)))) &&
     ((local_13 != 0 || (uVar1 = local_1c, local_20 <= local_1c)))) {
    local_1c = local_20;
    uVar1 = local_20;
  }
  local_20 = uVar1;
  if ((in_R8D != 0) && (in_R8D < local_1c)) {
    local_1c = in_R8D;
  }
  if ((in_R8D != 0) && (in_R8D < local_20)) {
    local_20 = in_R8D;
  }
  local_24 = local_1c;
  local_28 = local_20;
  dimension2d(&local_8,&local_24,&local_28);
  return local_8;
}

Assistant:

dimension2d<T> getOptimalSize(
			bool requirePowerOfTwo = true,
			bool requireSquare = false,
			bool larger = true,
			u32 maxValue = 0) const
	{
		u32 i = 1;
		u32 j = 1;
		if (requirePowerOfTwo) {
			while (i < (u32)Width)
				i <<= 1;
			if (!larger && i != 1 && i != (u32)Width)
				i >>= 1;
			while (j < (u32)Height)
				j <<= 1;
			if (!larger && j != 1 && j != (u32)Height)
				j >>= 1;
		} else {
			i = (u32)Width;
			j = (u32)Height;
		}

		if (requireSquare) {
			if ((larger && (i > j)) || (!larger && (i < j)))
				j = i;
			else
				i = j;
		}

		if (maxValue > 0 && i > maxValue)
			i = maxValue;

		if (maxValue > 0 && j > maxValue)
			j = maxValue;

		return dimension2d<T>((T)i, (T)j);
	}